

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateBuildingCode
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 != (Descriptor *)0x0 ||
        (((byte)this_00[1] & 2) != 0)) || (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) == '\x02'))
      || ((lVar1 = *(long *)(this_00 + 0x28), lVar1 != 0 && ((byte)this_00[1] & 0x10) != 0 &&
          ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    io::Printer::Print(printer,&this->variables_,
                       "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,"result.$name$_ = $name$_;\n");
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    printer->Print(variables_,
                   "if ($get_has_field_bit_from_local$) {\n"
                   "  $set_has_field_bit_to_local$;\n"
                   "}\n");
  }
  printer->Print(variables_, "result.$name$_ = $name$_;\n");
}